

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.h
# Opt level: O3

uint8_t * cbor_array_parse<cdns_question>
                    (uint8_t *in,uint8_t *in_max,
                    vector<cdns_question,_std::allocator<cdns_question>_> *v,int *err)

{
  int64_t val;
  int64_t local_40 [2];
  
  cbor_get_number(in,in_max,local_40);
  *err = -3;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* cbor_array_parse(uint8_t* in, uint8_t const* in_max, std::vector<InnerClass> * v, int* err)
{
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_ARRAY) {
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }
        
        while (rank < val && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                v->resize((size_t)rank + 1); 
                in = cbor_object_parse(in, in_max, &(*v)[rank], err);
                rank++;
            }
        }
    }

    return in;
}